

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomResources::write(DomResources *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  long lVar2;
  DomResource **ppDVar3;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  long lVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QString local_50;
  long local_38;
  
  aVar4._4_4_ = in_register_00000034;
  aVar4._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"resources";
    local_50.d.size = 9;
  }
  else {
    QString::toLower_helper(&local_50);
  }
  QVar8.m_size = (size_t)local_50.d.ptr;
  QVar8.field_0.m_data = aVar4.m_data;
  QXmlStreamWriter::writeStartElement(QVar8);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_name == true) {
    pQVar1 = &((this->m_attr_name).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_name).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar7.m_size = __n;
      QVar7.field_0.m_data = (void *)0x8000000000000004;
      QVar10.m_size = (size_t)L"name";
      QVar10.field_0.m_data = aVar4.m_data;
      QXmlStreamWriter::writeAttribute(QVar10,QVar7);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar6.m_size = __n;
      QVar6.field_0.m_data = (void *)0x8000000000000004;
      QVar9.m_size = (size_t)L"name";
      QVar9.field_0.m_data = aVar4.m_data;
      QXmlStreamWriter::writeAttribute(QVar9,QVar6);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  lVar2 = (this->m_include).d.size;
  if (lVar2 != 0) {
    ppDVar3 = (this->m_include).d.ptr;
    lVar5 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"include";
      local_50.d.size = 7;
      DomResource::write(*(DomResource **)((long)ppDVar3 + lVar5),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomResources::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resources") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    for (DomResource *v : m_include)
        v->write(writer, u"include"_s);

    writer.writeEndElement();
}